

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O3

int idaLsPrecSolveB(sunrealtype tt,N_Vector yyB,N_Vector ypB,N_Vector rrB,N_Vector rvecB,
                   N_Vector zvecB,sunrealtype c_jB,sunrealtype deltaB,void *ida_mem)

{
  IDAadjMem pIVar1;
  int iVar2;
  IDABMem IDAB_mem;
  sunrealtype local_58;
  sunrealtype local_50;
  IDALsMemB idalsB_mem;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  
  IDA_mem = (IDAMem)0x0;
  IDAADJ_mem = (IDAadjMem)0x0;
  idalsB_mem = (IDALsMemB)0x0;
  IDAB_mem = (IDABMem)0x0;
  local_58 = c_jB;
  local_50 = deltaB;
  idaLs_AccessLMemBCur(ida_mem,"idaLsPrecSolveB",&IDA_mem,&IDAADJ_mem,&IDAB_mem,&idalsB_mem);
  pIVar1 = IDAADJ_mem;
  if ((IDAADJ_mem->ia_noInterp == 0) &&
     (iVar2 = (*IDAADJ_mem->ia_getY)
                        (IDA_mem,tt,IDAADJ_mem->ia_yyTmp,IDAADJ_mem->ia_ypTmp,(N_Vector *)0x0,
                         (N_Vector *)0x0), iVar2 != 0)) {
    IDAProcessError(IDAB_mem->IDA_mem,-1,0x92d,"idaLsPrecSolveB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                    ,"Bad t for interpolation.");
    return -1;
  }
  iVar2 = (*idalsB_mem->psolveB)
                    (tt,pIVar1->ia_yyTmp,pIVar1->ia_ypTmp,yyB,ypB,rrB,rvecB,zvecB,local_58,local_50,
                     IDAB_mem->ida_user_data);
  return iVar2;
}

Assistant:

static int idaLsPrecSolveB(sunrealtype tt, N_Vector yyB, N_Vector ypB,
                           N_Vector rrB, N_Vector rvecB, N_Vector zvecB,
                           sunrealtype c_jB, sunrealtype deltaB, void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDALsMemB idalsB_mem;
  IDABMem IDAB_mem;
  int retval;

  /* access relevant memory structures */
  IDA_mem    = NULL;
  IDAADJ_mem = NULL;
  idalsB_mem = NULL;
  IDAB_mem   = NULL;
  retval     = idaLs_AccessLMemBCur(ida_mem, __func__, &IDA_mem, &IDAADJ_mem,
                                    &IDAB_mem, &idalsB_mem);

  /* Get forward solution from interpolation. */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    retval = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                 IDAADJ_mem->ia_ypTmp, NULL, NULL);
    if (retval != IDA_SUCCESS)
    {
      IDAProcessError(IDAB_mem->IDA_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_T);
      return (-1);
    }
  }

  /* Call user's adjoint psolveB routine */
  return (idalsB_mem->psolveB(tt, IDAADJ_mem->ia_yyTmp, IDAADJ_mem->ia_ypTmp,
                              yyB, ypB, rrB, rvecB, zvecB, c_jB, deltaB,
                              IDAB_mem->ida_user_data));
}